

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkLogicToNetlist(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Ntk_t *pAVar8;
  int iVar9;
  long lVar10;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                  ,0x99,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
  }
  iVar9 = 0;
  Abc_NtkCleanup(pNtk,0);
  Abc_NtkCheckUniqueCiNames(pNtk);
  Abc_NtkCheckUniqueCoNames(pNtk);
  Abc_NtkCheckUniqueCioNames(pNtk);
  iVar1 = Abc_NtkLogicHasSimpleCos(pNtk);
  if (iVar1 == 0) {
    pcVar3 = Abc_FrameReadFlag("silentmode");
    if (pcVar3 == (char *)0x0) {
      puts("Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.");
    }
    Abc_NtkLogicMakeSimpleCos(pNtk,0);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_NETLIST,pNtk->ntkFunc);
  for (; iVar9 < pNtk->vCis->nSize; iVar9 = iVar9 + 1) {
    pAVar4 = Abc_NtkCi(pNtk,iVar9);
    pcVar3 = Abc_ObjName(pAVar4);
    pAVar5 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar3);
    Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
    (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
  }
  for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar1);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
  }
  iVar1 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar1) {
      for (iVar1 = 0; iVar9 = pNtk->vObjs->nSize, iVar1 < iVar9; iVar1 = iVar1 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar1);
        if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
           ((((pAVar4->field_6).pCopy)->field_6).pTemp == (void *)0x0)) {
          pcVar3 = Abc_ObjName(pAVar4);
          pAVar5 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar3);
          Abc_ObjAddFanin(pAVar5,(pAVar4->field_6).pCopy);
          (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
        }
      }
      for (iVar1 = 0; iVar1 < iVar9; iVar1 = iVar1 + 1) {
        pAVar4 = Abc_NtkObj(pNtk,iVar1);
        if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
          for (lVar10 = 0; lVar10 < (pAVar4->vFanins).nSize; lVar10 = lVar10 + 1) {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                            *(Abc_Obj_t **)
                             (*(long *)((long)pAVar4->pNtk->vObjs->pArray
                                              [(pAVar4->vFanins).pArray[lVar10]] + 0x40) + 0x40));
          }
        }
        iVar9 = pNtk->vObjs->nSize;
      }
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar8 = Abc_NtkToNetlist(pNtk->pExdc);
        pNtk_00->pExdc = pAVar8;
      }
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 == 0) {
        fwrite("Abc_NtkLogicToNetlist(): Network check has failed.\n",0x33,1,_stdout);
      }
      return pNtk_00;
    }
    pAVar5 = Abc_NtkCo(pNtk,iVar1);
    pAVar4 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
    uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf;
    if (uVar2 == 2) {
LAB_001d560f:
      pcVar3 = Abc_ObjName(pAVar4);
      pcVar6 = Abc_ObjName(pAVar5);
      iVar9 = strcmp(pcVar3,pcVar6);
      if (iVar9 != 0) {
        __assert_fail("!strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                      ,0xbd,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
      }
LAB_001d5666:
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,(((pAVar4->field_6).pCopy)->field_6).pCopy);
    }
    else {
      if (uVar2 != 7) {
        if (uVar2 != 5) {
          __assert_fail("Abc_ObjIsNode(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                        ,0xc1,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
        }
        goto LAB_001d560f;
      }
      pAVar7 = (((pAVar4->field_6).pCopy)->field_6).pCopy;
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        pcVar3 = Abc_ObjName(pAVar7);
        pcVar6 = Abc_ObjName(pAVar5);
        iVar9 = strcmp(pcVar3,pcVar6);
        if (iVar9 != 0) {
          __assert_fail("!strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                        ,0xce,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
        }
        goto LAB_001d5666;
      }
      pcVar3 = Abc_ObjName(pAVar5);
      pAVar7 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar3);
      Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar7);
      Abc_ObjAddFanin(pAVar7,(pAVar4->field_6).pCopy);
      *(Abc_Obj_t **)((long)(pAVar4->field_6).pTemp + 0x40) = pAVar7;
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkLogicToNetlist( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNet, * pDriver, * pFanin;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );

    // remove dangling nodes
    Abc_NtkCleanup( pNtk, 0 );

    // make sure the CO names are unique
    Abc_NtkCheckUniqueCiNames( pNtk );
    Abc_NtkCheckUniqueCoNames( pNtk );
    Abc_NtkCheckUniqueCioNames( pNtk );

//    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    if ( !Abc_NtkLogicHasSimpleCos(pNtk) )
    {
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.\n" );
        Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    }

    // start the netlist by creating PI/PO/Latch objects
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_NETLIST, pNtk->ntkFunc );
    // create the CI nets and remember them in the new CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // duplicate all nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDupObj(pNtkNew, pObj, 0);
    // first add the nets to the CO drivers
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pDriver) )
        {
            assert( !strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
            continue;
        }
        assert( Abc_ObjIsNode(pDriver) );
        // if the CO driver has no net, create it
        if ( pDriver->pCopy->pCopy == NULL )
        {
            // create the CO net and connect it to CO
            pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
            Abc_ObjAddFanin( pObj->pCopy, pNet );
            // connect the CO net to the new driver and remember it in the new driver
            Abc_ObjAddFanin( pNet, pDriver->pCopy );
            pDriver->pCopy->pCopy = pNet;
        }
        else
        {
            assert( !strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
        }
    }
    // create the missing nets
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( pObj->pCopy->pCopy ) // the net of the new object is already created
            continue;
        // create the new net
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) ); // here we create ridiculous names net line "n48", where 48 is the ID of the node
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // connect nodes to the fanins nets
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToNetlist( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkLogicToNetlist(): Network check has failed.\n" );
    return pNtkNew;
}